

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass_table.hpp
# Opt level: O0

HSQOBJECT __thiscall squall::detail::KlassImp<Foo>::make_accessor_table(KlassImp<Foo> *this)

{
  HSQOBJECT HVar1;
  HSQOBJECT *in_stack_ffffffffffffffc8;
  HSQUIRRELVM v;
  KlassImp<Foo> *this_local;
  HSQOBJECT tableobj;
  
  sq_newtable((HSQUIRRELVM)tableobj._0_8_);
  v = (HSQUIRRELVM)&this_local;
  sq_getstackobj(v,(SQInteger)in_stack_ffffffffffffffc8,(HSQOBJECT *)0x109f79);
  sq_addref(v,in_stack_ffffffffffffffc8);
  sq_pop(v,(SQInteger)in_stack_ffffffffffffffc8);
  HVar1._4_4_ = 0;
  HVar1._type = (uint)this_local;
  HVar1._unVal = (SQObjectValue)tableobj._0_8_;
  return HVar1;
}

Assistant:

HSQOBJECT make_accessor_table() {
        HSQOBJECT tableobj;
        sq_newtable(vm_);
        sq_getstackobj(vm_, -1, &tableobj);
        sq_addref(vm_, &tableobj);
        sq_pop(vm_, 1);
        return tableobj;
    }